

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void __thiscall Fl_Widget_Type::copy_properties(Fl_Widget_Type *this)

{
  Fl_Image *pFVar1;
  Fl_Widget *this_00;
  Fl_Widget *pFVar2;
  Fl_Button *this_01;
  Fl_Valuator *this_02;
  Fl_Spinner *this_03;
  Fl_Fontsize FVar3;
  Fl_Color FVar4;
  Fl_Align FVar5;
  void *pvVar6;
  int iVar7;
  uint uVar8;
  
  this_00 = this->live_widget;
  if (this_00 != (Fl_Widget *)0x0) {
    Fl_Widget::label(this_00,(this->o->label_).value);
    Fl_Widget::tooltip(this_00,this->tooltip_);
    pFVar2 = this->o;
    this_00->type_ = pFVar2->type_;
    this_00->box_ = pFVar2->box_;
    FVar4 = pFVar2->color2_;
    this_00->color_ = pFVar2->color_;
    this_00->color2_ = FVar4;
    (this_00->label_).type = (pFVar2->label_).type;
    FVar3 = (pFVar2->label_).size;
    FVar4 = (pFVar2->label_).color;
    FVar5 = (pFVar2->label_).align_;
    (this_00->label_).font = (pFVar2->label_).font;
    (this_00->label_).size = FVar3;
    (this_00->label_).color = FVar4;
    (this_00->label_).align_ = FVar5;
    iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x18])(this);
    if (iVar7 != 0) {
      this_01 = (Fl_Button *)this->live_widget;
      pFVar2 = this->o;
      this_01->down_box_ = *(uchar *)((long)&pFVar2[1]._vptr_Fl_Widget + 6);
      this_01->shortcut_ = *(int *)&pFVar2[1]._vptr_Fl_Widget;
      Fl_Button::value(this_01,(int)*(char *)((long)&pFVar2[1]._vptr_Fl_Widget + 4));
    }
    iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x19])(this);
    if (iVar7 != 0) {
      *(undefined4 *)((long)&this->live_widget[1].label_.value + 4) =
           *(undefined4 *)((long)&this->o[1].label_.value + 4);
    }
    iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1a])(this);
    if (iVar7 != 0) {
      this->live_widget[2].color_ = this->o[2].color_;
    }
    iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1b])(this);
    if (iVar7 != 0) {
      this->live_widget[3].w_ = this->o[3].w_;
    }
    iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])(this);
    if (iVar7 != 0) {
      this_02 = (Fl_Valuator *)this->live_widget;
      pFVar2 = this->o;
      pvVar6 = pFVar2[1].user_data_;
      this_02->min = (double)pFVar2[1].callback_;
      this_02->max = (double)pvVar6;
      Fl_Valuator::step(this_02,*(double *)&pFVar2[1].x_ / (double)pFVar2[1].w_);
      Fl_Valuator::value(this_02,(double)pFVar2[1]._vptr_Fl_Widget);
      iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])(this);
      if (1 < iVar7) {
        Fl_Slider::slider_size((Fl_Slider *)this->live_widget,(double)(float)this->o[1].h_);
      }
    }
    iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1d])(this);
    if (iVar7 != 0) {
      this_03 = (Fl_Spinner *)this->live_widget;
      pFVar2 = this->o;
      pFVar1 = pFVar2[1].label_.image;
      this_03->minimum_ = (double)pFVar2[1].label_.value;
      this_03->maximum_ = (double)pFVar1;
      pFVar1 = pFVar2[1].label_.deimage;
      this_03->step_ = (double)pFVar1;
      (this_03->input_).super_Fl_Input_.super_Fl_Widget.type_ =
           '\x02' - ((double)(int)(double)pFVar1 != (double)pFVar1);
      Fl_Spinner::update(this_03);
      this_03->value_ = *(double *)&pFVar2[1].w_;
      Fl_Spinner::update(this_03);
    }
    uVar8 = this->o->flags_;
    if ((uVar8 & 2) != 0) {
      (*this_00->_vptr_Fl_Widget[6])(this_00);
      uVar8 = this->o->flags_;
    }
    if ((uVar8 & 1) != 0) {
      Fl_Widget::deactivate(this_00);
    }
    iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])(this);
    pFVar2 = this->o;
    if (iVar7 == 0) {
      if (pFVar2->parent_ == (Fl_Group *)0x0) {
        return;
      }
      if (pFVar2->parent_->resizable_ != pFVar2) {
        return;
      }
    }
    else if (pFVar2[1].callback_ == (Fl_Callback *)0x0) {
      return;
    }
    if (this_00->parent_ != (Fl_Group *)0x0) {
      this_00->parent_->resizable_ = pFVar2;
    }
  }
  return;
}

Assistant:

void Fl_Widget_Type::copy_properties() {
  if (!live_widget) 
    return;

  // copy all attributes common to all widget types
  Fl_Widget *w = live_widget;
  w->label(o->label());
  w->tooltip(tooltip());
  w->type(o->type());
  w->box(o->box());
  w->color(o->color());
  w->selection_color(o->selection_color());
  w->labeltype(o->labeltype());
  w->labelfont(o->labelfont());
  w->labelsize(o->labelsize());
  w->labelcolor(o->labelcolor());
  w->align(o->align());

  // copy all attributes specific to widgets derived from Fl_Button
  if (is_button()) {
    Fl_Button* d = (Fl_Button*)live_widget, *s = (Fl_Button*)o;
    d->down_box(s->down_box());
    d->shortcut(s->shortcut());
    d->value(s->value());
  }

  // copy all attributes specific to widgets derived from Fl_Input_
  if (is_input()) {
    Fl_Input_* d = (Fl_Input_*)live_widget, *s = (Fl_Input_*)o;
    d->shortcut(s->shortcut());
  }

  // copy all attributes specific to widgets derived from Fl_Value_Input
  if (is_value_input()) {
    Fl_Value_Input* d = (Fl_Value_Input*)live_widget, *s = (Fl_Value_Input*)o;
    d->shortcut(s->shortcut());
  }

  // copy all attributes specific to widgets derived from Fl_Text_Display
  if (is_text_display()) {
    Fl_Text_Display* d = (Fl_Text_Display*)live_widget, *s = (Fl_Text_Display*)o;
    d->shortcut(s->shortcut());
  }

  // copy all attributes specific to Fl_Valuator and derived classes
  if (is_valuator()) {
    Fl_Valuator* d = (Fl_Valuator*)live_widget, *s = (Fl_Valuator*)o;
    d->minimum(s->minimum());
    d->maximum(s->maximum());
    d->step(s->step());
    d->value(s->value());
    if (is_valuator()>=2) {
      Fl_Slider *d = (Fl_Slider*)live_widget, *s = (Fl_Slider*)o;
      d->slider_size(s->slider_size());
    }
  }

  // copy all attributes specific to Fl_Spinner and derived classes
  if (is_spinner()) {
    Fl_Spinner* d = (Fl_Spinner*)live_widget, *s = (Fl_Spinner*)o;
    d->minimum(s->minimum());
    d->maximum(s->maximum());
    d->step(s->step());
    d->value(s->value());
  }
 
/* TODO: implement this
  {Fl_Font ff; int fs; Fl_Color fc; if (textstuff(4,ff,fs,fc)) {
    Fl_Font f; int s; Fl_Color c; textstuff(0,f,s,c);
    if (f != ff) write_string("textfont %d", f);
    if (s != fs) write_string("textsize %d", s);
    if (c != fc) write_string("textcolor %d", c);
  }}*/

  if (!o->visible()) 
    w->hide();
  if (!o->active()) 
    w->deactivate();
  if (resizable() && w->parent()) 
    w->parent()->resizable(o);
}